

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

bool __thiscall wasm::Literal::isZero(Literal *this)

{
  BasicType BVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint8_t zeros [16];
  
  BVar1 = Type::getBasic(&this->type);
  switch(BVar1) {
  case i32:
    bVar2 = (this->field_0).i32 == 0;
    break;
  case i64:
    bVar2 = (this->field_0).i64 == 0;
    break;
  case f32:
    bVar2 = *(float *)&this->field_0 == 0.0;
    goto LAB_0012a95e;
  case f64:
    bVar2 = *(double *)&this->field_0 == 0.0;
LAB_0012a95e:
    bVar2 = (bool)(-bVar2 & 1);
    break;
  case v128:
    auVar3[0] = -((this->field_0).v128[0] == '\0');
    auVar3[1] = -((this->field_0).v128[1] == '\0');
    auVar3[2] = -((this->field_0).v128[2] == '\0');
    auVar3[3] = -((this->field_0).v128[3] == '\0');
    auVar3[4] = -((this->field_0).v128[4] == '\0');
    auVar3[5] = -((this->field_0).v128[5] == '\0');
    auVar3[6] = -((this->field_0).v128[6] == '\0');
    auVar3[7] = -((this->field_0).v128[7] == '\0');
    auVar3[8] = -((this->field_0).v128[8] == '\0');
    auVar3[9] = -((this->field_0).v128[9] == '\0');
    auVar3[10] = -((this->field_0).v128[10] == '\0');
    auVar3[0xb] = -((this->field_0).v128[0xb] == '\0');
    auVar3[0xc] = -((this->field_0).v128[0xc] == '\0');
    auVar3[0xd] = -((this->field_0).v128[0xd] == '\0');
    auVar3[0xe] = -((this->field_0).v128[0xe] == '\0');
    auVar3[0xf] = -((this->field_0).v128[0xf] == '\0');
    bVar2 = (ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff;
    break;
  default:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
               ,0x7f);
  }
  return bVar2;
}

Assistant:

bool isZero() const {
    switch (type.getBasic()) {
      case Type::i32:
        return i32 == 0;
      case Type::i64:
        return i64 == 0LL;
      case Type::f32:
        return bit_cast<float>(i32) == 0.0f;
      case Type::f64:
        return bit_cast<double>(i64) == 0.0;
      case Type::v128: {
        uint8_t zeros[16] = {0};
        return memcmp(&v128, zeros, 16) == 0;
      }
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }